

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  long lVar3;
  int iVar4;
  u32 key;
  Pgno PVar5;
  uint uVar6;
  BtShared *pBVar7;
  Pgno PVar8;
  int iVar9;
  uint uVar10;
  u64 v;
  MemPage *pMVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  uchar *pCell;
  u8 *__dest;
  uint local_c4;
  uint local_c0;
  int local_bc;
  int loc;
  Pgno local_b4;
  u8 *local_b0;
  uint local_a4;
  uint local_a0;
  int rc;
  MemPage *local_98;
  BtreePayload *local_90;
  BtCursor *local_88;
  BtShared *local_80;
  BtShared *local_78;
  uint *local_70;
  MemPage *local_68;
  UnpackedRecord r;
  
  pBtree = pCur->pBtree;
  pBVar7 = pBtree->pBt;
  uVar15 = local_c4;
  loc = seekResult;
  if ((pCur->curFlags & 0x20) != 0) {
    local_c4 = saveAllCursors(pBVar7,pCur->pgnoRoot,pCur);
    if (local_c4 != 0) {
      return local_c4;
    }
    uVar15 = 0;
    if ((seekResult != 0) && (pCur->iPage < '\0')) {
      iVar4 = sqlite3CorruptError(0x12877);
      return iVar4;
    }
  }
  local_c4 = uVar15;
  local_80 = pBVar7;
  if ((2 < pCur->eState) && (local_c4 = moveToRoot(pCur), (local_c4 & 0xffffffef) != 0)) {
    return local_c4;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    if (pBtree->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    }
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if (seekResult == 0) {
        iVar4 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&loc);
        if (iVar4 != 0) {
          return iVar4;
        }
        local_c4 = 0;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar4 = btreeOverwriteCell(pCur,pX);
      return iVar4;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        iVar4 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&loc);
      }
      else {
        r.aMem = pX->aMem;
        r.default_rc = '\0';
        r.eqSeen = '\0';
        r.pKeyInfo = pCur->pKeyInfo;
        r.nField = pX->nMem;
        iVar4 = sqlite3BtreeIndexMoveto(pCur,&r,&loc);
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      local_c4 = 0;
      seekResult = loc;
    }
    if (seekResult == 0) {
      getCellInfo(pCur);
      lVar3 = (pCur->info).nKey;
      if (lVar3 == pX->nKey) {
        r.u = (anon_union_8_2_94730112_for_u)pX->pKey;
        r._36_4_ = SUB84(lVar3,0);
        iVar4 = btreeOverwriteCell(pCur,(BtreePayload *)&r);
        return iVar4;
      }
    }
  }
  pMVar11 = pCur->pPage;
  if (pMVar11->nFree < 0) {
    if (1 < pCur->eState) {
      iVar4 = 0x128f2;
      goto LAB_0013cb69;
    }
    iVar4 = btreeComputeFreeSpace(pMVar11);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_c4 = 0;
  }
  local_b0 = local_80->pTmpSpace;
  if (-1 < (char)flags) {
    bVar1 = pMVar11->childPtrSize;
    local_90 = pX;
    local_88 = pCur;
    if (pMVar11->intKey == '\0') {
      pvVar14 = pX->pKey;
      uVar13 = pX->nKey;
      if ((uint)uVar13 < 0x80) {
        local_b0[bVar1] = (u8)uVar13;
        uVar15 = 1;
        local_bc = flags;
      }
      else {
        local_bc = flags;
        uVar15 = sqlite3PutVarint(local_b0 + bVar1,(long)(int)(uint)uVar13);
        uVar15 = uVar15 & 0xff;
      }
      iVar4 = uVar15 + bVar1;
      v = uVar13 & 0xffffffff;
    }
    else {
      uVar13 = (ulong)pX->nData;
      v = (long)pX->nZero + uVar13;
      pvVar14 = pX->pData;
      if ((uint)v < 0x80) {
        uVar15 = 1;
        local_b0[bVar1] = (u8)v;
        local_bc = flags;
      }
      else {
        local_bc = flags;
        uVar15 = sqlite3PutVarint(local_b0 + bVar1,v);
        uVar15 = uVar15 & 0xff;
      }
      uVar15 = uVar15 + bVar1;
      iVar4 = sqlite3PutVarint(local_b0 + uVar15,local_90->nKey);
      iVar4 = iVar4 + uVar15;
    }
    __dest = local_b0 + iVar4;
    iVar9 = (int)v;
    local_68 = pMVar11;
    if ((int)(uint)pMVar11->maxLocal < iVar9) {
      uVar2 = pMVar11->minLocal;
      local_78 = pMVar11->pBt;
      local_98 = (MemPage *)0x0;
      uVar15 = (iVar9 - (uint)uVar2) % (local_78->usableSize - 4) + (uint)uVar2;
      if ((int)(uint)pMVar11->maxLocal < (int)uVar15) {
        uVar15 = (uint)uVar2;
      }
      local_a0 = iVar4 + uVar15 + 4;
      local_b4 = 0;
      local_70 = (uint *)(local_b0 + (int)(uVar15 + iVar4));
LAB_0013c7b4:
      do {
        uVar10 = (uint)v;
        uVar6 = uVar15;
        if ((int)uVar10 < (int)uVar15) {
          uVar6 = uVar10;
        }
        uVar12 = (uint)uVar13;
        if ((int)uVar12 < (int)uVar6) {
          if ((int)uVar12 < 1) {
            memset(__dest,0,(long)(int)uVar6);
          }
          else {
            memcpy(__dest,pvVar14,uVar13 & 0xffffffff);
            uVar6 = uVar12;
          }
        }
        else {
          memcpy(__dest,pvVar14,(long)(int)uVar6);
        }
        pBVar7 = local_78;
        v = (u64)(uVar10 - uVar6);
        if (uVar10 - uVar6 == 0 || (int)uVar10 < (int)uVar6) goto LAB_0013c965;
        __dest = __dest + (int)uVar6;
        pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar6);
        uVar13 = (ulong)(uVar12 - uVar6);
        uVar15 = uVar15 - uVar6;
        if (uVar15 == 0) {
          r.pKeyInfo = (KeyInfo *)0x0;
          local_a4 = local_b4;
          if (local_78->autoVacuum != '\0') {
            local_c0 = sqlite3PendingByte;
            PVar8 = local_b4;
            do {
              do {
                uVar15 = PVar8;
                PVar8 = uVar15 + 1;
                PVar5 = ptrmapPageno(pBVar7,PVar8);
              } while (PVar8 == PVar5);
            } while (uVar15 == local_c0 / pBVar7->pageSize);
            local_b4 = uVar15 + 1;
          }
          uVar6 = allocateBtreePage(pBVar7,(MemPage **)&r,&local_b4,local_b4,'\0');
          PVar8 = local_b4;
          rc = uVar6;
          if ((pBVar7->autoVacuum == '\0') || (uVar6 != 0)) {
            pBVar7 = local_78;
            pMVar11 = local_98;
            if (uVar6 == 0) goto LAB_0013c8dd;
          }
          else {
            ptrmapPut(pBVar7,local_b4,'\x04' - (local_a4 == 0),local_a4,&rc);
            pMVar11 = local_98;
            uVar6 = rc;
            if (rc == 0) {
LAB_0013c8dd:
              *local_70 = PVar8 >> 0x18 | (PVar8 & 0xff0000) >> 8 | (PVar8 & 0xff00) << 8 |
                          PVar8 << 0x18;
              releasePage(local_98);
              local_98 = (MemPage *)r.pKeyInfo;
              local_70 = *(uint **)(r.pKeyInfo + 2);
              *local_70 = 0;
              __dest = (u8 *)(*(long *)(r.pKeyInfo + 2) + 4);
              uVar15 = pBVar7->usableSize - 4;
              goto LAB_0013c7b4;
            }
            releasePage((MemPage *)r.pKeyInfo);
          }
          releasePage(pMVar11);
          uVar15 = local_a0;
          goto LAB_0013c984;
        }
      } while( true );
    }
    local_c0 = 4;
    if (4 < iVar4 + iVar9) {
      local_c0 = iVar4 + iVar9;
    }
    iVar4 = (int)uVar13;
    memcpy(__dest,pvVar14,(long)iVar4);
    uVar6 = 0;
    memset(__dest + iVar4,0,(long)(iVar9 - iVar4));
    uVar15 = local_c0;
    goto LAB_0013c984;
  }
  local_c4 = 0;
  uVar13 = 4;
  if (4 < local_80->nPreformatSize) {
    uVar13 = (ulong)(uint)local_80->nPreformatSize;
  }
  if ((local_80->autoVacuum != '\0') && ((uint)pMVar11->maxLocal < (uint)uVar13)) {
    local_bc = flags;
    (*pMVar11->xParseCell)(pMVar11,local_b0,(CellInfo *)&r);
    uVar6 = 0;
    if (r.u.i._0_4_ != (uint)(ushort)r.u.i._4_2_) {
      key = sqlite3Get4byte(local_b0 + (uVar13 - 4));
      ptrmapPut(local_80,key,'\x03',pMVar11->pgno,(int *)&local_c4);
      uVar6 = local_c4;
    }
    goto LAB_0013c98e;
  }
LAB_0013c99c:
  uVar15 = (uint)uVar13;
  uVar2 = pCur->ix;
  uVar6 = (uint)uVar2;
  if (loc == 0) {
    if (pMVar11->nCell <= uVar2) {
      iVar4 = 0x12916;
LAB_0013cb69:
      iVar4 = sqlite3CorruptError(iVar4);
      return iVar4;
    }
    local_c0 = uVar15;
    iVar4 = sqlite3PagerWrite(pMVar11->pDbPage);
    if (iVar4 != 0) {
      return iVar4;
    }
    pCell = pMVar11->aData +
            (CONCAT11(pMVar11->aCellIdx[(ulong)uVar2 * 2],pMVar11->aCellIdx[(ulong)uVar2 * 2 + 1]) &
            pMVar11->maskPage);
    if (pMVar11->leaf == '\0') {
      *(undefined4 *)local_b0 = *(undefined4 *)pCell;
    }
    local_bc = flags;
    (*pMVar11->xParseCell)(pMVar11,pCell,(CellInfo *)&r);
    uVar15 = 0;
    if (r.u.i._0_4_ != (uint)(ushort)r.u.i._4_2_) {
      uVar15 = clearCellOverflow(pMVar11,pCell,(CellInfo *)&r);
    }
    pCur->curFlags = pCur->curFlags & 0xfb;
    local_c4 = uVar15;
    if (local_c0 == (ushort)r.u.i._6_2_) {
      if ((r.u.i._0_4_ == (uint)(ushort)r.u.i._4_2_) &&
         ((local_80->autoVacuum == '\0' || (local_c0 < pMVar11->minLocal)))) {
        if (pCell < pMVar11->aData + (ulong)pMVar11->hdrOffset + 10) {
          iVar4 = 0x12931;
        }
        else {
          if (pCell + local_c0 <= pMVar11->aDataEnd) {
            memcpy(pCell,local_b0,(ulong)local_c0);
            return 0;
          }
          iVar4 = 0x12934;
        }
        goto LAB_0013cb69;
      }
    }
    dropCell(pMVar11,(uint)uVar2,(uint)(ushort)r.u.i._6_2_,(int *)&local_c4);
    flags = local_bc;
    uVar15 = local_c0;
    if (local_c4 != 0) {
      return local_c4;
    }
  }
  else if ((loc < 0) && (pMVar11->nCell != 0)) {
    pCur->ix = uVar2 + 1;
    uVar6 = (uint)(ushort)(uVar2 + 1);
    pCur->curFlags = pCur->curFlags & 0xfd;
  }
  insertCell(pMVar11,uVar6,local_b0,uVar15,(u8 *)0x0,0,(int *)&local_c4);
  (pCur->info).nSize = 0;
  uVar15 = local_c4;
  if (pMVar11->nOverflow != '\0') {
    pCur->curFlags = pCur->curFlags & 0xfd;
    uVar15 = balance(pCur);
    pCur->pPage->nOverflow = '\0';
    pCur->eState = '\x01';
    if ((uVar15 == 0 & (byte)flags >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur);
      uVar15 = 0;
      if (pCur->pKeyInfo != (KeyInfo *)0x0) {
        pvVar14 = sqlite3Malloc(pX->nKey);
        pCur->pKey = pvVar14;
        if (pvVar14 == (void *)0x0) {
          uVar15 = 7;
        }
        else {
          memcpy(pvVar14,pX->pKey,pX->nKey);
        }
      }
      pCur->eState = '\x03';
      pCur->nKey = pX->nKey;
    }
  }
  return uVar15;
LAB_0013c965:
  releasePage(local_98);
  uVar6 = 0;
  uVar15 = local_a0;
LAB_0013c984:
  uVar13 = (ulong)uVar15;
  pMVar11 = local_68;
  pCur = local_88;
  pX = local_90;
  local_c4 = uVar6;
LAB_0013c98e:
  flags = local_bc;
  if (uVar6 != 0) {
    return uVar6;
  }
  goto LAB_0013c99c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_BKPT;
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = pBt->nPreformatSize;
    if( szNew<4 ) szNew = 4;
    if( ISAUTOVACUUM && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
  }
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_BKPT;
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_BKPT;
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_BKPT;
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}